

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

Aig_Obj_t * Saig_BmcIntervalConstruct_rec(Saig_Bmc_t *p,Aig_Obj_t *pObj,int i,Vec_Int_t *vVisited)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  
  pAVar4 = Saig_BmcObjFrame(p,pObj,i);
  if (pAVar4 == (Aig_Obj_t *)0x0) {
    if (((*(uint *)&pObj->field_0x18 & 7) == 2) &&
       (pAVar2 = p->pAig, iVar3 = Aig_ObjCioId(pObj), iVar3 < pAVar2->nTruePis)) {
      pAVar4 = Aig_ObjCreateCi(p->pFrm);
    }
    else {
      iVar3 = Saig_ObjIsLo(p->pAig,pObj);
      if (iVar3 == 0) {
        uVar1 = *(uint *)&pObj->field_0x18;
        Saig_BmcIntervalConstruct_rec
                  (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),i,vVisited);
        pAVar5 = Saig_BmcObjChild0(p,pObj,i);
        pAVar4 = pAVar5;
        if (((uVar1 & 7) != 3) &&
           (pAVar4 = (Aig_Obj_t *)((ulong)p->pFrm->pConst1 ^ 1), pAVar5 != pAVar4)) {
          Saig_BmcIntervalConstruct_rec
                    (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),i,vVisited);
          pAVar2 = p->pFrm;
          pAVar4 = Saig_BmcObjChild0(p,pObj,i);
          if (((ulong)pObj & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                          ,0x62,"Aig_Obj_t *Saig_BmcObjChild1(Saig_Bmc_t *, Aig_Obj_t *, int)");
          }
          pAVar5 = Saig_BmcObjFrame(p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),i);
          pAVar4 = Aig_And(pAVar2,pAVar4,
                           (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ (ulong)pAVar5));
        }
      }
      else {
        pAVar4 = Saig_ObjLoToLi(p->pAig,pObj);
        pAVar4 = Saig_BmcIntervalConstruct_rec(p,pAVar4,i + -1,vVisited);
      }
    }
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      __assert_fail("pRes != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                    ,0x1c4,
                    "Aig_Obj_t *Saig_BmcIntervalConstruct_rec(Saig_Bmc_t *, Aig_Obj_t *, int, Vec_Int_t *)"
                   );
    }
    Saig_BmcObjSetFrame(p,pObj,i,pAVar4);
    Vec_IntPush(vVisited,pObj->Id);
    Vec_IntPush(vVisited,i);
  }
  return pAVar4;
}

Assistant:

Aig_Obj_t * Saig_BmcIntervalConstruct_rec( Saig_Bmc_t * p, Aig_Obj_t * pObj, int i, Vec_Int_t * vVisited )
{
    Aig_Obj_t * pRes;
    pRes = Saig_BmcObjFrame( p, pObj, i );
    if ( pRes != NULL )
        return pRes;
    if ( Saig_ObjIsPi( p->pAig, pObj ) )
        pRes = Aig_ObjCreateCi(p->pFrm);
    else if ( Saig_ObjIsLo( p->pAig, pObj ) )
        pRes = Saig_BmcIntervalConstruct_rec( p, Saig_ObjLoToLi(p->pAig, pObj), i-1, vVisited );
    else if ( Aig_ObjIsCo( pObj ) )
    {
        Saig_BmcIntervalConstruct_rec( p, Aig_ObjFanin0(pObj), i, vVisited );
        pRes = Saig_BmcObjChild0( p, pObj, i );
    }
    else 
    {
        Saig_BmcIntervalConstruct_rec( p, Aig_ObjFanin0(pObj), i, vVisited );
        if ( Saig_BmcObjChild0(p, pObj, i) == Aig_ManConst0(p->pFrm) )
            pRes = Aig_ManConst0(p->pFrm);
        else
        {
            Saig_BmcIntervalConstruct_rec( p, Aig_ObjFanin1(pObj), i, vVisited );
            pRes = Aig_And( p->pFrm, Saig_BmcObjChild0(p, pObj, i), Saig_BmcObjChild1(p, pObj, i) );
        }
    }
    assert( pRes != NULL );
    Saig_BmcObjSetFrame( p, pObj, i, pRes );
    Vec_IntPush( vVisited, Aig_ObjId(pObj) );
    Vec_IntPush( vVisited, i );
    return pRes;
}